

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getPrimalray(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *p_vector)

{
  int *piVar1;
  int iVar2;
  pointer pnVar3;
  int iVar4;
  Status SVar5;
  undefined8 *puVar6;
  long lVar7;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  pointer pnVar8;
  uint *puVar9;
  uint *puVar10;
  long lVar11;
  long lVar12;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->initialized != false) {
    pnVar8 = (p_vector->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar3 = (p_vector->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pnVar8 != pnVar3) {
      do {
        (pnVar8->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar8->m_backend).prec_elem = 0x1c;
        (pnVar8->m_backend).data._M_elems[0] = 0;
        (pnVar8->m_backend).data._M_elems[1] = 0;
        (pnVar8->m_backend).data._M_elems[2] = 0;
        (pnVar8->m_backend).data._M_elems[3] = 0;
        (pnVar8->m_backend).data._M_elems[4] = 0;
        (pnVar8->m_backend).data._M_elems[5] = 0;
        (pnVar8->m_backend).data._M_elems[6] = 0;
        (pnVar8->m_backend).data._M_elems[7] = 0;
        (pnVar8->m_backend).data._M_elems[8] = 0;
        (pnVar8->m_backend).data._M_elems[9] = 0;
        (pnVar8->m_backend).data._M_elems[10] = 0;
        (pnVar8->m_backend).data._M_elems[0xb] = 0;
        (pnVar8->m_backend).data._M_elems[0xc] = 0;
        (pnVar8->m_backend).data._M_elems[0xd] = 0;
        (pnVar8->m_backend).data._M_elems[0xe] = 0;
        (pnVar8->m_backend).data._M_elems[0xf] = 0;
        (pnVar8->m_backend).data._M_elems[0x10] = 0;
        (pnVar8->m_backend).data._M_elems[0x11] = 0;
        (pnVar8->m_backend).data._M_elems[0x12] = 0;
        (pnVar8->m_backend).data._M_elems[0x13] = 0;
        (pnVar8->m_backend).data._M_elems[0x14] = 0;
        (pnVar8->m_backend).data._M_elems[0x15] = 0;
        (pnVar8->m_backend).data._M_elems[0x16] = 0;
        (pnVar8->m_backend).data._M_elems[0x17] = 0;
        (pnVar8->m_backend).data._M_elems[0x18] = 0;
        (pnVar8->m_backend).data._M_elems[0x19] = 0;
        (pnVar8->m_backend).data._M_elems[0x1a] = 0;
        (pnVar8->m_backend).data._M_elems[0x1b] = 0;
        *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x6d) = 0;
        pnVar8 = pnVar8 + 1;
      } while (pnVar8 != pnVar3);
      pnVar3 = (p_vector->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar8 = (p_vector->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar8 != pnVar3; pnVar8 = pnVar8 + 1
          ) {
        (pnVar8->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar8->m_backend).prec_elem = 0x1c;
        (pnVar8->m_backend).data._M_elems[0] = 0;
        (pnVar8->m_backend).data._M_elems[1] = 0;
        (pnVar8->m_backend).data._M_elems[2] = 0;
        (pnVar8->m_backend).data._M_elems[3] = 0;
        (pnVar8->m_backend).data._M_elems[4] = 0;
        (pnVar8->m_backend).data._M_elems[5] = 0;
        (pnVar8->m_backend).data._M_elems[6] = 0;
        (pnVar8->m_backend).data._M_elems[7] = 0;
        (pnVar8->m_backend).data._M_elems[8] = 0;
        (pnVar8->m_backend).data._M_elems[9] = 0;
        (pnVar8->m_backend).data._M_elems[10] = 0;
        (pnVar8->m_backend).data._M_elems[0xb] = 0;
        (pnVar8->m_backend).data._M_elems[0xc] = 0;
        (pnVar8->m_backend).data._M_elems[0xd] = 0;
        (pnVar8->m_backend).data._M_elems[0xe] = 0;
        (pnVar8->m_backend).data._M_elems[0xf] = 0;
        (pnVar8->m_backend).data._M_elems[0x10] = 0;
        (pnVar8->m_backend).data._M_elems[0x11] = 0;
        (pnVar8->m_backend).data._M_elems[0x12] = 0;
        (pnVar8->m_backend).data._M_elems[0x13] = 0;
        (pnVar8->m_backend).data._M_elems[0x14] = 0;
        (pnVar8->m_backend).data._M_elems[0x15] = 0;
        (pnVar8->m_backend).data._M_elems[0x16] = 0;
        (pnVar8->m_backend).data._M_elems[0x17] = 0;
        (pnVar8->m_backend).data._M_elems[0x18] = 0;
        (pnVar8->m_backend).data._M_elems[0x19] = 0;
        (pnVar8->m_backend).data._M_elems[0x1a] = 0;
        (pnVar8->m_backend).data._M_elems[0x1b] = 0;
        *(undefined8 *)((long)(pnVar8->m_backend).data._M_elems + 0x6d) = 0;
      }
    }
    if (0 < (this->primalRay).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused) {
      lVar11 = 0x80;
      lVar12 = 0;
      do {
        piVar1 = (int *)((long)(((this->primalRay).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem)->val).m_backend.data._M_elems + lVar11);
        iVar2 = *piVar1;
        pnVar8 = (p_vector->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar9 = (uint *)(piVar1 + -0x20);
        puVar10 = (uint *)(pnVar8 + iVar2);
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar10 = *puVar9;
          puVar9 = puVar9 + 1;
          puVar10 = puVar10 + 1;
        }
        pnVar8[iVar2].m_backend.exp = piVar1[-4];
        pnVar8[iVar2].m_backend.neg = SUB41(piVar1[-3],0);
        iVar4 = piVar1[-1];
        pnVar8[iVar2].m_backend.fpclass = piVar1[-2];
        pnVar8[iVar2].m_backend.prec_elem = iVar4;
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x84;
      } while (lVar12 < (this->primalRay).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused);
    }
    SVar5 = status(this);
    return SVar5;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"XSOLVE10 No Problem loaded","");
  *puVar6 = &PTR__SPxException_0069d438;
  puVar6[1] = puVar6 + 3;
  std::__cxx11::string::_M_construct<char*>((string *)(puVar6 + 1),local_40,local_40 + local_38);
  *puVar6 = &PTR__SPxException_0069d650;
  __cxa_throw(puVar6,&SPxStatusException::typeinfo,SPxException::~SPxException);
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getPrimalray(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE10 No Problem loaded");
      // return NOT_INIT;
   }

   assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::UNBOUNDED);
   p_vector.clear();
   p_vector = primalRay;

   return status();
}